

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GEN_Register.cpp
# Opt level: O3

uint8_t __thiscall GEN_Register::getReg_8(GEN_Register *this,string *flagName)

{
  int iVar1;
  bitset<8UL> *pbVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)flagName);
  if (iVar1 == 0) {
    pbVar2 = &AH;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)flagName);
    if (iVar1 == 0) {
      pbVar2 = &AL;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)flagName);
      if (iVar1 == 0) {
        pbVar2 = &DH;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)flagName);
        if (iVar1 == 0) {
          pbVar2 = &DL;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)flagName);
          if (iVar1 == 0) {
            pbVar2 = &CH;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)flagName);
            if (iVar1 == 0) {
              pbVar2 = &CL;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)flagName);
              if (iVar1 == 0) {
                pbVar2 = &BH;
              }
              else {
                std::__cxx11::string::compare((char *)flagName);
                pbVar2 = &BL;
              }
            }
          }
        }
      }
    }
  }
  return (uint8_t)(pbVar2->super__Base_bitset<1UL>)._M_w;
}

Assistant:

uint8_t GEN_Register::getReg_8(std::string flagName)
{
	if (flagName == "AH")
	{
		return (uint8_t)(AH.to_ulong());
	}
	else if (flagName == "AL")
	{
		return (uint8_t)(AL.to_ulong());
	}
    else if (flagName == "DH")
    {
        return (uint8_t)(DH.to_ulong());
    }
    else if (flagName == "DL")
    {
        return (uint8_t)(DL.to_ulong());
    }
    else if (flagName == "CH")
    {
        return (uint8_t)(CH.to_ulong());
    }
    else if (flagName == "CL")
    {
        return (uint8_t)(CL.to_ulong());
    }
    else if (flagName == "BH")
    {
        return (uint8_t)(BH.to_ulong());
    }
    else if (flagName == "BL")
    {
        return (uint8_t)(BL.to_ulong());
    }
}